

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
* deqp::gles31::Functional::anon_unknown_0::generateBasic2DCaseIterations
            (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *pvVar10;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX_00;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX_01;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX_02;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX_03;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *extraout_RAX_04;
  int iVar11;
  TextureFormat *pTVar12;
  uint uVar13;
  ulong uVar14;
  value_type local_7c;
  ulong local_58;
  int local_50;
  GatherType local_4c;
  IVec2 *local_48;
  ulong local_40;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  pvVar10 = (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *)(ulong)gatherType;
  pTVar12 = textureFormat;
  local_4c = gatherType;
  local_48 = offsetRange;
  local_38 = pvVar10;
  do {
    if (local_4c < GATHERTYPE_LAST) {
      iVar11 = uVar13 - 1;
      local_7c.componentNdx = iVar11;
      switch((long)&switchD_016210f8::switchdataD_01c7f0b8 +
             (long)(int)(&switchD_016210f8::switchdataD_01c7f0b8)[(long)local_38]) {
      case 0x16210fa:
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[0].m_data[0] = 0;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pvVar10 = extraout_RAX;
        break;
      case 0x162111e:
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[0].m_data[0] = 0;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pvVar10 = extraout_RAX_00;
        break;
      case 0x1621142:
        uVar1 = local_48->m_data[0];
        local_58 = (ulong)uVar1;
        uVar3 = -uVar1;
        if (0 < (int)uVar1) {
          uVar3 = uVar1;
        }
        iVar2 = local_48->m_data[1];
        iVar4 = (int)uVar1 >> 0x1f;
        if (0 < (int)uVar1) {
          iVar4 = 1;
        }
        iVar5 = -iVar2;
        if (0 < iVar2) {
          iVar5 = iVar2;
        }
        iVar6 = iVar2 >> 0x1f;
        if (0 < iVar2) {
          iVar6 = 1;
        }
        local_7c.offsets[0].m_data[1] = uVar1;
        local_7c.offsets[0].m_data[0] = uVar1;
        local_7c.offsets[1].m_data[1] = iVar2;
        local_7c.offsets[1].m_data[0] = uVar1;
        local_7c.offsets[2].m_data[1] = uVar1;
        local_7c.offsets[2].m_data[0] = iVar2;
        local_7c.offsets[3].m_data[1] = iVar2;
        local_7c.offsets[3].m_data[0] = iVar2;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pTVar12 = (TextureFormat *)((ulong)textureFormat & 0xffffffff);
        pvVar10 = extraout_RAX_01;
        if (uVar13 != 0) goto LAB_0162140d;
        local_7c.offsets[3].m_data[0] = (iVar5 / 2) * iVar6;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[2].m_data = local_7c.offsets[3].m_data << 0x20;
        local_7c.offsets[0].m_data = local_58 | local_7c.offsets[2].m_data;
        local_7c.offsets[1].m_data[0] = ((int)uVar3 / 2) * iVar4;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pvVar10 = extraout_RAX_02;
        break;
      case 0x1621236:
        uVar1 = local_48->m_data[0];
        uVar3 = local_48->m_data[1];
        local_7c.offsets[0].m_data = *&local_48->m_data;
        local_58 = (ulong)uVar3;
        uVar7 = -uVar1;
        if (0 < (int)uVar1) {
          uVar7 = uVar1;
        }
        local_50 = (int)uVar1 >> 0x1f;
        if (0 < (int)uVar1) {
          local_50 = 1;
        }
        uVar8 = -uVar3;
        if (0 < (int)uVar3) {
          uVar8 = uVar3;
        }
        iVar2 = (int)uVar3 >> 0x1f;
        if (0 < (int)uVar3) {
          iVar2 = 1;
        }
        uVar14 = local_58 << 0x20;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pTVar12 = (TextureFormat *)((ulong)textureFormat & 0xffffffff);
        pvVar10 = extraout_RAX_03;
        if (uVar13 != 0) goto LAB_0162140d;
        local_40 = (ulong)uVar1 << 0x20;
        local_7c.offsets[0].m_data[1] = uVar1;
        local_7c.offsets[0].m_data[0] = uVar1;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        uVar9 = local_58;
        local_7c.offsets[0].m_data = (int  [2])(local_40 | local_58);
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        local_7c.offsets[0].m_data = (int  [2])(uVar14 | uVar9);
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        local_7c.offsets[0].m_data = (int  [2])((ulong)(uint)(((int)uVar8 / 2) * iVar2) << 0x20);
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        local_7c.offsets[0].m_data[0] = ((int)uVar7 / 2) * local_50;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        local_7c.offsets[2].m_data[0] = 0;
        local_7c.offsets[2].m_data[1] = 0;
        local_7c.offsets[3].m_data[0] = 0;
        local_7c.offsets[3].m_data[1] = 0;
        local_7c.offsets[0].m_data[0] = 0;
        local_7c.offsets[0].m_data[1] = 0;
        local_7c.offsets[1].m_data[0] = 0;
        local_7c.offsets[1].m_data[1] = 0;
        local_7c.componentNdx = iVar11;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_7c);
        pvVar10 = extraout_RAX_04;
      }
      pTVar12 = (TextureFormat *)((ulong)textureFormat & 0xffffffff);
    }
LAB_0162140d:
    if (((3 < uVar13) || ((int)pTVar12 == 0x12)) || (uVar13 = uVar13 + 1, (int)pTVar12 == 0x14)) {
      return pvVar10;
    }
  } while( true );
}

Assistant:

vector<GatherArgs> generateBasic2DCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const int			numComponentCases	= isDepthFormat(textureFormat) ? 1 : 4+1; // \note For non-depth textures, test explicit components 0 to 3 and implicit component 0.
	vector<GatherArgs>	result;

	for (int componentCaseNdx = 0; componentCaseNdx < numComponentCases; componentCaseNdx++)
	{
		const int componentNdx = componentCaseNdx - 1;

		switch (gatherType)
		{
			case GATHERTYPE_BASIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSET:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx, IVec2(min, max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
				{
					result.push_back(GatherArgs(componentNdx, IVec2(min,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	max)));

					result.push_back(GatherArgs(componentNdx, IVec2(0,		hmax)));
					result.push_back(GatherArgs(componentNdx, IVec2(hmin,	0)));
					result.push_back(GatherArgs(componentNdx, IVec2(0,		0)));
				}

				break;
			}

			case GATHERTYPE_OFFSET_DYNAMIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSETS:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx,
											IVec2(min,	min),
											IVec2(min,	max),
											IVec2(max,	min),
											IVec2(max,	max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
					result.push_back(GatherArgs(componentNdx,
												IVec2(min,	hmax),
												IVec2(hmin,	max),
												IVec2(0,	hmax),
												IVec2(hmax,	0)));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}